

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O3

void __thiscall ValidationSignals::SyncWithValidationInterfaceQueue(ValidationSignals *this)

{
  function<void_()> func;
  undefined8 uVar1;
  promise<void> *__state;
  long in_FS_OFFSET;
  promise<void> promise;
  undefined8 in_stack_ffffffffffffff98;
  _State_baseV2 *in_stack_ffffffffffffffa0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffa8;
  promise<void> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::promise<void>::promise(&local_30);
  func.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffffa0;
  func.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffff98;
  func.super__Function_base._M_manager = (_Manager_type)in_stack_ffffffffffffffa8._M_pi;
  func._M_invoker = (_Invoker_type)&local_30;
  CallFunctionInValidationInterfaceQueue(this,func);
  std::
  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp:149:44)>
  ::_M_manager((_Any_data *)&stack0xffffffffffffffb0,(_Any_data *)&stack0xffffffffffffffb0,
               __destroy_functor);
  __state = &local_30;
  std::__basic_future<void>::__basic_future
            ((__basic_future<void> *)&stack0xffffffffffffffa0,&__state->_M_future);
  if (in_stack_ffffffffffffffa0 == (_State_baseV2 *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      uVar1 = std::__throw_future_error(3);
      __clang_call_terminate(uVar1);
    }
  }
  else {
    std::__future_base::_State_baseV2::wait(in_stack_ffffffffffffffa0,__state);
    if (in_stack_ffffffffffffffa8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_ffffffffffffffa8._M_pi)
      ;
    }
    std::promise<void>::~promise(&local_30);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::SyncWithValidationInterfaceQueue()
{
    AssertLockNotHeld(cs_main);
    // Block until the validation queue drains
    std::promise<void> promise;
    CallFunctionInValidationInterfaceQueue([&promise] {
        promise.set_value();
    });
    promise.get_future().wait();
}